

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mipmaps_image *
rf_load_dds_image_from_file_ez(rf_mipmaps_image *__return_storage_ptr__,char *file)

{
  _Bool _Var1;
  void *__size;
  void *dst;
  size_t __size_00;
  void *pvVar2;
  
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->mipmaps = 0;
  (__return_storage_ptr__->field_0).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  __size = (void *)rf_libc_get_file_size(__return_storage_ptr__,file);
  pvVar2 = __size;
  dst = malloc((size_t)__size);
  _Var1 = rf_libc_load_file_into_buffer(pvVar2,file,dst,(rf_int)__size);
  if (_Var1) {
    __size_00 = rf_get_dds_image_size(dst,(rf_int)__size);
    pvVar2 = malloc(__size_00);
    rf_load_dds_image_to_buffer(__return_storage_ptr__,dst,(rf_int)__size,pvVar2,__size_00);
  }
  free(dst);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_dds_image_from_file_ez(const char* file) { return rf_load_dds_image_from_file(file, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_IO); }